

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O0

boolean compress_data(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JDIMENSION JVar1;
  int iVar2;
  jpeg_c_coef_controller *pjVar3;
  jpeg_component_info *pjVar4;
  forward_DCT_ptr p_Var5;
  uint uVar6;
  boolean bVar7;
  JDIMENSION local_6c;
  forward_DCT_ptr forward_DCT;
  jpeg_component_info *compptr;
  JDIMENSION local_50;
  JDIMENSION xpos;
  JDIMENSION ypos;
  int blockcnt;
  int yoffset;
  int yindex;
  int ci;
  int bi;
  int blkn;
  JDIMENSION last_iMCU_row;
  JDIMENSION last_MCU_col;
  JDIMENSION MCU_col_num;
  my_coef_ptr_conflict1 coef;
  JSAMPIMAGE input_buf_local;
  j_compress_ptr cinfo_local;
  
  pjVar3 = cinfo->coef;
  uVar6 = cinfo->MCUs_per_row - 1;
  JVar1 = cinfo->total_iMCU_rows;
  ypos = *(JDIMENSION *)&pjVar3[1].compress_data;
  do {
    if (*(int *)((long)&pjVar3[1].compress_data + 4) <= (int)ypos) {
      *(int *)&pjVar3[1].start_pass = *(int *)&pjVar3[1].start_pass + 1;
      start_iMCU_row(cinfo);
      return 1;
    }
    for (last_iMCU_row = *(JDIMENSION *)((long)&pjVar3[1].start_pass + 4); last_iMCU_row <= uVar6;
        last_iMCU_row = last_iMCU_row + 1) {
      ci = 0;
      for (yoffset = 0; yoffset < cinfo->comps_in_scan; yoffset = yoffset + 1) {
        pjVar4 = cinfo->cur_comp_info[yoffset];
        p_Var5 = cinfo->fdct->forward_DCT[pjVar4->component_index];
        if (last_iMCU_row < uVar6) {
          local_6c = pjVar4->MCU_width;
        }
        else {
          local_6c = pjVar4->last_col_width;
        }
        iVar2 = pjVar4->MCU_sample_width;
        local_50 = ypos * pjVar4->DCT_v_scaled_size;
        for (blockcnt = 0; blockcnt < pjVar4->MCU_height; blockcnt = blockcnt + 1) {
          if ((*(uint *)&pjVar3[1].start_pass < JVar1 - 1) ||
             ((int)(ypos + blockcnt) < pjVar4->last_row_height)) {
            (*p_Var5)(cinfo,pjVar4,input_buf[pjVar4->component_index],
                      (JBLOCKROW)(&pjVar3[2].start_pass)[ci],local_50,last_iMCU_row * iVar2,local_6c
                     );
            if ((int)local_6c < pjVar4->MCU_width) {
              memset((&pjVar3[2].start_pass)[(int)(ci + local_6c)],0,
                     (long)(int)(pjVar4->MCU_width - local_6c) << 7);
              for (yindex = local_6c; yindex < pjVar4->MCU_width; yindex = yindex + 1) {
                *(undefined2 *)(&pjVar3[2].start_pass)[ci + yindex] =
                     *(undefined2 *)(&pjVar3[2].start_pass)[ci + yindex + -1];
              }
            }
          }
          else {
            memset((&pjVar3[2].start_pass)[ci],0,(long)pjVar4->MCU_width << 7);
            for (yindex = 0; yindex < pjVar4->MCU_width; yindex = yindex + 1) {
              *(undefined2 *)(&pjVar3[2].start_pass)[ci + yindex] =
                   *(undefined2 *)(&pjVar3[2].start_pass)[ci + -1];
            }
          }
          ci = pjVar4->MCU_width + ci;
          local_50 = pjVar4->DCT_v_scaled_size + local_50;
        }
      }
      bVar7 = (*cinfo->entropy->encode_mcu)(cinfo,(JBLOCKROW *)(pjVar3 + 2));
      if (bVar7 == 0) {
        *(JDIMENSION *)&pjVar3[1].compress_data = ypos;
        *(JDIMENSION *)((long)&pjVar3[1].start_pass + 4) = last_iMCU_row;
        return 0;
      }
    }
    *(undefined4 *)((long)&pjVar3[1].start_pass + 4) = 0;
    ypos = ypos + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
compress_data (j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, bi, ci, yindex, yoffset, blockcnt;
  JDIMENSION ypos, xpos;
  jpeg_component_info *compptr;
  forward_DCT_ptr forward_DCT;

  /* Loop to write as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num <= last_MCU_col;
	 MCU_col_num++) {
      /* Determine where data comes from in input_buf and do the DCT thing.
       * Each call on forward_DCT processes a horizontal row of DCT blocks
       * as wide as an MCU; we rely on having allocated the MCU_buffer[] blocks
       * sequentially.  Dummy blocks at the right or bottom edge are filled in
       * specially.  The data in them does not matter for image reconstruction,
       * so we fill them with values that will encode to the smallest amount of
       * data, viz: all zeroes in the AC entries, DC entries equal to previous
       * block's DC value.  (Thanks to Thomas Kinsman for this idea.)
       */
      blkn = 0;
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	forward_DCT = cinfo->fdct->forward_DCT[compptr->component_index];
	blockcnt = (MCU_col_num < last_MCU_col) ? compptr->MCU_width
						: compptr->last_col_width;
	xpos = MCU_col_num * compptr->MCU_sample_width;
	ypos = yoffset * compptr->DCT_v_scaled_size;
	/* ypos == (yoffset+yindex) * DCTSIZE */
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  if (coef->iMCU_row_num < last_iMCU_row ||
	      yoffset+yindex < compptr->last_row_height) {
	    (*forward_DCT) (cinfo, compptr,
			    input_buf[compptr->component_index],
			    coef->MCU_buffer[blkn],
			    ypos, xpos, (JDIMENSION) blockcnt);
	    if (blockcnt < compptr->MCU_width) {
	      /* Create some dummy blocks at the right edge of the image. */
	      FMEMZERO((void FAR *) coef->MCU_buffer[blkn + blockcnt],
		       (compptr->MCU_width - blockcnt) * SIZEOF(JBLOCK));
	      for (bi = blockcnt; bi < compptr->MCU_width; bi++) {
		coef->MCU_buffer[blkn+bi][0][0] = coef->MCU_buffer[blkn+bi-1][0][0];
	      }
	    }
	  } else {
	    /* Create a row of dummy blocks at the bottom of the image. */
	    FMEMZERO((void FAR *) coef->MCU_buffer[blkn],
		     compptr->MCU_width * SIZEOF(JBLOCK));
	    for (bi = 0; bi < compptr->MCU_width; bi++) {
	      coef->MCU_buffer[blkn+bi][0][0] = coef->MCU_buffer[blkn-1][0][0];
	    }
	  }
	  blkn += compptr->MCU_width;
	  ypos += compptr->DCT_v_scaled_size;
	}
      }
      /* Try to write the MCU.  In event of a suspension failure, we will
       * re-DCT the MCU on restart (a bit inefficient, could be fixed...)
       */
      if (! (*cinfo->entropy->encode_mcu) (cinfo, coef->MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->mcu_ctr = MCU_col_num;
	return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}